

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::find<int>(raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *this,key_arg<int> *key)

{
  bool bVar1;
  hasher *this_00;
  size_t hash;
  key_arg<int> *key_local;
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::hash_internal::Hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_local;
  
  AssertOnFind<int>(this,key);
  bVar1 = is_soo(this);
  if (bVar1) {
    _this_local = find_soo<int>(this,key);
  }
  else {
    prefetch_heap_block(this);
    this_00 = hash_ref(this);
    hash = hash_internal::HashImpl<int>::operator()((HashImpl<int> *)this_00,key);
    _this_local = find_non_soo<int>(this,key,hash);
  }
  return _this_local;
}

Assistant:

iterator find(const key_arg<K>& key) ABSL_ATTRIBUTE_LIFETIME_BOUND {
    AssertOnFind(key);
    if (is_soo()) return find_soo(key);
    prefetch_heap_block();
    return find_non_soo(key, hash_ref()(key));
  }